

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O1

int anon_unknown.dwarf_1d097::skip_input_output_arg(char *arg,char *input_fname)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(arg,input_fname);
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    iVar1 = strcmp(arg,"-o");
    uVar2 = 2;
    if (iVar1 != 0) {
      iVar1 = strcmp(arg,"--output");
      if (iVar1 != 0) {
        iVar1 = strncmp(arg,"--output=",9);
        uVar2 = (uint)(iVar1 == 0);
      }
    }
  }
  return uVar2;
}

Assistant:

int skip_input_output_arg(const char *arg, const char *input_fname) {
  if (strcmp(arg, input_fname) == 0) {
    return 1;
  }
  if (strcmp(arg, "-o") == 0 || strcmp(arg, "--output") == 0) {
    return 2;
  }
  if (strncmp(arg, "--output=", strlen("--output=")) == 0) {
    return 1;
  }
  return 0;
}